

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O0

int ncnn::deconvolution1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined4 *puVar2;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar3;
  float fVar4;
  int in_stack_00000008;
  undefined4 in_stack_00000010;
  long *in_stack_00000018;
  int i_1;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  int q;
  float *kptr;
  float *outptr;
  int j;
  float bias;
  Mat out;
  int p;
  int bias_term;
  int outh;
  int outw;
  int h;
  int w;
  int i;
  float *ptr;
  int size;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_29c;
  undefined4 local_26c;
  int local_24c;
  int local_23c;
  int local_234;
  long local_230;
  int local_220;
  undefined4 *local_208;
  int *local_200;
  long local_1f8;
  undefined4 local_1f0;
  long *local_1e8;
  undefined4 local_1e0;
  int local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  long local_1c8;
  int local_1c0;
  uint local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  long *local_198;
  long *local_190;
  long *local_188;
  undefined4 **local_180;
  undefined4 **local_168;
  undefined4 **local_160;
  int local_148;
  undefined4 local_144;
  undefined4 **local_140;
  undefined4 *local_138;
  undefined4 local_120;
  int local_11c;
  long *local_118;
  undefined4 **local_110;
  long local_108;
  long *local_100;
  int local_f4;
  undefined4 *local_f0;
  int local_e8;
  undefined4 local_e4;
  undefined4 **local_e0;
  undefined4 **local_d8;
  int local_c4;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  long *local_90;
  float local_84 [3];
  long *local_78;
  undefined8 local_70;
  long *local_68;
  undefined8 local_60;
  long *local_58;
  undefined8 local_50;
  long *local_48;
  undefined8 local_40;
  long *local_38;
  long *local_30;
  undefined4 local_24;
  long local_20;
  undefined4 *local_18;
  undefined4 local_10;
  int local_c;
  undefined4 **local_8;
  
  local_1ac = *(int *)((long)in_RDI + 0x2c);
  local_1b0 = (int)in_RDI[6];
  local_1b4 = *(int *)((long)in_RSI + 0x2c);
  local_1b8 = (int)in_RSI[6];
  bVar3 = true;
  if (*in_RCX != 0) {
    bVar3 = in_RCX[8] * (long)(int)in_RCX[7] == 0;
  }
  local_1bc = (uint)!bVar3;
  local_1a8 = in_R9D;
  local_1a4 = in_R8D;
  local_1a0 = in_RCX;
  local_198 = in_RDX;
  local_190 = in_RSI;
  local_188 = in_RDI;
  for (local_1c0 = 0; local_1c0 < local_1b8; local_1c0 = local_1c0 + 1) {
    local_110 = &local_208;
    local_118 = local_190;
    local_11c = local_1c0;
    local_120 = 1;
    local_e8 = *(int *)((long)local_190 + 0x2c);
    puVar2 = (undefined4 *)
             (*local_190 + (long)*(int *)((long)local_190 + 0x2c) * (long)local_1c0 * local_190[2]);
    local_20 = local_190[2];
    local_24 = (undefined4)local_190[3];
    local_30 = (long *)local_190[4];
    local_8 = &local_208;
    local_10 = 1;
    local_200 = (int *)0x0;
    local_1e0 = 2;
    local_1d8 = 1;
    local_1d4 = 1;
    local_1d0 = 1;
    local_1c8 = (long)local_e8;
    if (local_1bc == 0) {
      local_26c = 0;
    }
    else {
      local_108 = (long)local_1c0;
      local_100 = local_1a0;
      local_26c = *(undefined4 *)(*local_1a0 + local_108 * 4);
    }
    local_e0 = &local_208;
    local_e4 = local_26c;
    local_f0 = puVar2;
    for (local_f4 = 0; local_f4 < local_e8; local_f4 = local_f4 + 1) {
      *local_f0 = local_26c;
      local_f0 = local_f0 + 1;
    }
    for (local_220 = 0; local_220 < local_1ac; local_220 = local_220 + 1) {
      local_160 = &local_208;
      local_230 = *local_198 + (long)(local_1a4 * local_1b0 * local_1c0) * 4;
      for (local_234 = 0; local_234 < local_1b0; local_234 = local_234 + 1) {
        local_c4 = local_234;
        fVar4 = *(float *)(*local_188 +
                           (long)*(int *)((long)local_188 + 0x2c) * (long)local_234 * local_188[2] +
                          (long)local_220 * 4);
        for (local_23c = 0; local_23c < local_1a4; local_23c = local_23c + 1) {
          puVar2[(long)(local_220 * local_1a8) + (long)(local_23c * in_stack_00000008)] =
               fVar4 * *(float *)(local_230 + (long)local_23c * 4) +
               (float)puVar2[(long)(local_220 * local_1a8) + (long)(local_23c * in_stack_00000008)];
        }
        local_230 = local_230 + (long)local_1a4 * 4;
      }
    }
    local_168 = &local_208;
    local_d8 = local_e0;
    local_18 = puVar2;
    local_c = local_e8;
    local_208 = puVar2;
    local_1f8 = local_20;
    local_1f0 = local_24;
    local_1e8 = local_30;
    local_1dc = local_e8;
    for (local_24c = 0; local_24c < local_1b4; local_24c = local_24c + 1) {
      local_29c = (float)puVar2[local_24c];
      local_90 = in_stack_00000018;
      local_84[0] = local_29c;
      switch(in_stack_00000010) {
      case 1:
        if (local_29c <= 0.0) {
          local_84[0] = 0.0;
        }
        break;
      case 2:
        local_38 = in_stack_00000018;
        local_40 = 0;
        local_94 = *(float *)*in_stack_00000018;
        if (local_29c <= 0.0) {
          local_29c = local_29c * local_94;
        }
        local_84[0] = local_29c;
        break;
      case 3:
        local_48 = in_stack_00000018;
        local_50 = 0;
        local_98 = *(float *)*in_stack_00000018;
        local_58 = in_stack_00000018;
        local_60 = 1;
        local_9c = *(float *)(*in_stack_00000018 + 4);
        if (local_29c < local_98) {
          local_84[0] = local_98;
        }
        if (local_9c < local_84[0]) {
          local_84[0] = local_9c;
        }
        break;
      case 4:
        local_a0 = 88.37626;
        pfVar1 = std::min<float>(local_84,&local_a0);
        local_84[0] = *pfVar1;
        local_a4 = -88.37626;
        pfVar1 = std::max<float>(local_84,&local_a4);
        local_84[0] = *pfVar1;
        fVar4 = expf(-local_84[0]);
        local_84[0] = 1.0 / (fVar4 + 1.0);
        break;
      case 5:
        fVar4 = expf(local_29c);
        fVar4 = logf(fVar4 + 1.0);
        local_84[0] = tanhf(fVar4);
        local_84[0] = local_29c * local_84[0];
        break;
      case 6:
        local_68 = in_stack_00000018;
        local_70 = 0;
        local_a8 = *(float *)*in_stack_00000018;
        local_78 = in_stack_00000018;
        local_84[1] = 1.4013e-45;
        local_84[2] = 0.0;
        local_ac = *(float *)(*in_stack_00000018 + 4);
        local_b0 = -local_ac / local_a8;
        local_b4 = 1.0 / local_a8 + local_b0;
        if (local_b0 <= local_29c) {
          if (local_29c <= local_b4) {
            local_84[0] = local_29c * (local_29c * local_a8 + local_ac);
          }
        }
        else {
          local_84[0] = 0.0;
        }
      }
      puVar2[local_24c] = local_84[0];
    }
    local_180 = &local_208;
    local_140 = local_180;
    if (local_200 != (int *)0x0) {
      local_144 = 0xffffffff;
      LOCK();
      local_148 = *local_200;
      *local_200 = *local_200 + -1;
      UNLOCK();
      if (local_148 == 1) {
        if (local_1e8 == (long *)0x0) {
          local_138 = local_208;
          if (local_208 != (undefined4 *)0x0) {
            free(local_208);
          }
        }
        else {
          (**(code **)(*local_1e8 + 0x18))(local_1e8,local_208);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int deconvolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        Mat out = top_blob.row_range(p, 1);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int j = 0; j < w; j++)
        {
            float* outptr = (float*)out + j * stride_w;

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float val = bottom_blob.row(q)[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }

                kptr += kernel_w;
            }
        }

        {
            float* outptr = out;

            for (int i = 0; i < outw; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}